

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForbiddenPointFinder.cpp
# Opt level: O3

void __thiscall ForbiddenPointFinder::clear(ForbiddenPointFinder *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  Stone *pSVar4;
  long lVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  this->nForbiddenPoints = 0;
  pSVar4 = this->cBoard[0] + 0x10;
  lVar5 = 0;
  do {
    this->cBoard[0][lVar5] = Wall;
    this->cBoard[0x10][lVar5] = Wall;
    (*(Stone (*) [17])(pSVar4 + -0x10))[0] = Wall;
    *pSVar4 = Wall;
    auVar3 = _DAT_00105030;
    auVar2 = _DAT_00105020;
    auVar1 = _DAT_00105010;
    lVar5 = lVar5 + 1;
    pSVar4 = pSVar4 + 0x11;
  } while (lVar5 != 0x11);
  pSVar4 = this->cBoard[1] + 4;
  lVar5 = 1;
  do {
    lVar6 = 0;
    do {
      auVar7._8_4_ = (int)lVar6;
      auVar7._0_8_ = lVar6;
      auVar7._12_4_ = (int)((ulong)lVar6 >> 0x20);
      auVar8 = (auVar7 | auVar2) ^ auVar3;
      if (auVar8._4_4_ == -0x80000000 && auVar8._0_4_ < -0x7ffffff1) {
        pSVar4[lVar6 + -3] = Empty;
        pSVar4[lVar6 + -2] = Empty;
      }
      auVar7 = (auVar7 | auVar1) ^ auVar3;
      if (auVar7._4_4_ == -0x80000000 && auVar7._0_4_ < -0x7ffffff1) {
        pSVar4[lVar6 + -1] = Empty;
        pSVar4[lVar6] = Empty;
      }
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0x10);
    lVar5 = lVar5 + 1;
    pSVar4 = pSVar4 + 0x11;
  } while (lVar5 != 0x10);
  return;
}

Assistant:

void ForbiddenPointFinder::clear() {
    nForbiddenPoints = 0;

    for (int i = 0; i < BoardSize + 2; i++) {
        cBoard[0][i] = Stone ::Wall;
        cBoard[(BoardSize + 1)][i] = Stone ::Wall;
        cBoard[i][0] = Stone ::Wall;
        cBoard[i][(BoardSize + 1)] = Stone ::Wall;
    }

    for (int i = 1; i <= BoardSize; i++)
        for (int j = 1; j <= BoardSize; j++)
            cBoard[i][j] = Stone::Empty;
}